

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

void __thiscall
gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image
          (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this)

{
  if ((-1 < this->n) && (this->pixel != (uchar *)0x0)) {
    operator_delete__(this->pixel);
  }
  if (this->row != (uchar **)0x0) {
    operator_delete__(this->row);
  }
  if (this->img != (uchar ***)0x0) {
    operator_delete__(this->img);
    return;
  }
  return;
}

Assistant:

~Image()
    {
      if (n >= 0)
      {
        delete [] pixel;
      }

      delete [] row;
      delete [] img;
    }